

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int opentin(void)

{
  boolean bVar1;
  char cVar2;
  char *pcVar3;
  obj *obj;
  int iVar4;
  char *pcVar5;
  bool bVar6;
  char *local_48;
  obj *cookie;
  char *pcStack_18;
  int which;
  char *what;
  int r;
  
  if (((tin.tin)->where == '\x03') || (bVar1 = obj_here(tin.tin,(int)u.ux,(int)u.uy), bVar1 != '\0')
     ) {
    iVar4 = tin.usedtime + 1;
    if (tin.usedtime < 0x32) {
      if (iVar4 < tin.reqtime) {
        what._4_4_ = 1;
        tin.usedtime = iVar4;
      }
      else {
        tin.usedtime = iVar4;
        if (((*(uint *)&(tin.tin)->field_0x4a >> 0xf & 1) == 0) &&
           ((((*(uint *)&(tin.tin)->field_0x4a & 1) == 0 || ((tin.tin)->spe == -1)) ||
            (iVar4 = rn2(8), iVar4 != 0)))) {
          pline("You succeed in opening the tin.");
          if ((tin.tin)->spe == '\x01') {
            if ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0) {
              pline("It contains spinach.");
            }
            else {
              if (((u.uprops[0x1e].intrinsic != 0) ||
                  ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
                 (bVar6 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
                bVar6 = false;
                if (ublindf != (obj *)0x0) {
                  bVar6 = ublindf->oartifact == '\x1d';
                }
                bVar6 = (bool)(bVar6 ^ 1);
              }
              pcVar5 = " ";
              if (bVar6) {
                pcVar5 = "";
              }
              if ((((u.uprops[0x1e].intrinsic == 0) &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                local_48 = hcolor("green");
              }
              else {
                local_48 = "";
              }
              pline("It contains some decaying%s%s substance.",pcVar5,local_48);
            }
            cVar2 = yn_function("Eat it?","yn",'n');
            if (cVar2 == 'n') {
              if ((((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                  ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0'))
                  )) && ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0)) {
                *(uint *)&(tin.tin)->field_0x4a =
                     *(uint *)&(tin.tin)->field_0x4a & 0xffffffef | 0x10;
                *(uint *)&(tin.tin)->field_0x4a =
                     *(uint *)&(tin.tin)->field_0x4a & 0xffffffdf | 0x20;
              }
              if (flags.verbose != '\0') {
                pline("You discard the open tin.");
              }
              costly_tin((char *)0x0);
            }
            else {
              *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a & 0xffffffef | 0x10;
              *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a & 0xffffffdf | 0x20;
              costly_tin((char *)0x0);
              if ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0) {
                bVar6 = false;
                if (u.uprops[0x23].intrinsic != 0) {
                  bVar6 = true;
                  if ((u.uprops[0x24].extrinsic == 0) && (bVar6 = false, u.umonnum != u.umonster)) {
                    bVar1 = dmgtype(youmonst.data,0x24);
                    bVar6 = bVar1 != '\0';
                  }
                  bVar6 = (bool)(bVar6 ^ 1);
                }
                pcVar5 = "Popeye";
                if (bVar6) {
                  pcVar5 = "Swee\'pea";
                }
                pline("This makes you feel like %s!",pcVar5);
              }
              lesshungry(600);
              gainstr(tin.tin,0,'\0');
              violated(5);
            }
          }
          else if ((tin.tin)->corpsenm == -1) {
            pline("It turns out to be empty.");
            *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a & 0xffffffef | 0x10;
            *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a & 0xffffffdf | 0x20;
            costly_tin((char *)0x0);
          }
          else {
            if ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0) {
              if ((tin.tin)->spe == -1) {
                what._0_4_ = 5;
              }
              else {
                what._0_4_ = rn2(0xf);
              }
            }
            else {
              what._0_4_ = 4;
            }
            if (((tin.tin)->corpsenm == 0x153) && ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0)) {
              what._0_4_ = 0xf;
            }
            if (((int)what == 4) &&
               (((tin.tin)->corpsenm == 0x154 || ((tin.tin)->corpsenm == 0xa3)))) {
              what._0_4_ = 5;
            }
            else if (((tin.tin)->spe == -1) &&
                    (((*(uint *)&(tin.tin)->field_0x4a >> 1 & 1) == 0 &&
                     (iVar4 = rn2(7), iVar4 == 0)))) {
              what._0_4_ = 4;
            }
            cookie._4_4_ = 0;
            if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
               ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0'))))
            {
              pcStack_18 = mons_mname(mons + (tin.tin)->corpsenm);
              if (((mons[(tin.tin)->corpsenm].geno & 0x1000) != 0) &&
                 (cookie._4_4_ = 2, (mons[(tin.tin)->corpsenm].mflags2 & 0x80000) != 0)) {
                cookie._4_4_ = 1;
              }
            }
            else {
              pcStack_18 = rndmonnam();
            }
            if (cookie._4_4_ == 0) {
              pcStack_18 = makeplural(pcStack_18);
            }
            pcVar5 = "";
            if (cookie._4_4_ == 2) {
              pcVar5 = "the ";
            }
            pline("It smells like %s%s.",pcVar5,pcStack_18);
            cVar2 = yn_function("Eat it?","yn",'n');
            if (cVar2 == 'n') {
              if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
                 ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))
                 ) {
                *(uint *)&(tin.tin)->field_0x4a =
                     *(uint *)&(tin.tin)->field_0x4a & 0xffffffef | 0x10;
                *(uint *)&(tin.tin)->field_0x4a =
                     *(uint *)&(tin.tin)->field_0x4a & 0xffffffdf | 0x20;
              }
              if (flags.verbose != '\0') {
                pline("You discard the open tin.");
              }
              costly_tin((char *)0x0);
            }
            else {
              victual.piece = (obj *)0x0;
              victual._20_1_ = victual._20_1_ & 0xf1;
              pcVar5 = tintxts[(int)what].txt;
              pcVar3 = mons_mname(mons + (tin.tin)->corpsenm);
              pline("You consume %s %s.",pcVar5,pcVar3);
              if (((int)what == 10) && (iVar4 = rn2(2), iVar4 != 0)) {
                obj = mksobj(level,0x122,'\0','\0');
                *(uint *)&obj->field_0x4a =
                     *(uint *)&obj->field_0x4a & 0xfffffffd |
                     (*(uint *)&(tin.tin)->field_0x4a >> 1 & 1) << 1;
                *(uint *)&obj->field_0x4a =
                     *(uint *)&obj->field_0x4a & 0xfffffffe | *(uint *)&(tin.tin)->field_0x4a & 1;
                pline("There is a free fortune cookie inside!");
                hold_another_object(obj,"It falls to the floor.",(char *)0x0,(char *)0x0);
              }
              if (((((((mons[(tin.tin)->corpsenm].mlet == '\x02') ||
                      (mons[(tin.tin)->corpsenm].mlet == '\n')) ||
                     (mons[(tin.tin)->corpsenm].mlet == ' ')) ||
                    ((mons[(tin.tin)->corpsenm].mlet == '\x16' ||
                     (mons[(tin.tin)->corpsenm].mlet == '\x19')))) ||
                   ((mons[(tin.tin)->corpsenm].mlet == '\x1f' &&
                    (((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0x9e)))) ||
                  (((mons[(tin.tin)->corpsenm].mlet == '7' &&
                    (((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0x106)) &&
                   (((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0x104)))) ||
                 ((mons[(tin.tin)->corpsenm].mlet == '6' ||
                  ((mons[(tin.tin)->corpsenm].mlet == '*' &&
                   (((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0xd6)))))) {
                if (((((mons[(tin.tin)->corpsenm].mlet == '\x02') ||
                      (((mons[(tin.tin)->corpsenm].mlet == '\n' ||
                        (mons[(tin.tin)->corpsenm].mlet == ' ')) ||
                       (mons[(tin.tin)->corpsenm].mlet == '\x16')))) ||
                     ((mons[(tin.tin)->corpsenm].mlet == '\x19' ||
                      ((mons[(tin.tin)->corpsenm].mlet == '\x1f' &&
                       (((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0x9e)))))) ||
                    ((mons[(tin.tin)->corpsenm].mlet == '7' &&
                     ((((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0x106 &&
                      (((long)(tin.tin)->corpsenm & 0x3ffffffffffffffU) != 0x104)))))) ||
                   (mons[(tin.tin)->corpsenm].mlet == '6')) {
                  violated(5);
                }
                else {
                  violated(6);
                }
              }
              else {
                violated(7);
              }
              *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a & 0xffffffef | 0x10;
              *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a & 0xffffffdf | 0x20;
              cprefx((tin.tin)->corpsenm);
              cpostfx((tin.tin)->corpsenm);
              costly_tin((char *)0x0);
              if (tintxts[(int)what].nut < 0) {
                iVar4 = rn2(0xf);
                make_vomiting((long)(iVar4 + 10),'\0');
              }
              else {
                lesshungry(tintxts[(int)what].nut);
              }
              if (((int)what == 0) || ((int)what == 0xb)) {
                iVar4 = rnd(0xf);
                incr_itimeout(&u.uprops[0x29].intrinsic,(long)iVar4);
                pcVar5 = body_part(3);
                pcVar5 = makeplural(pcVar5);
                pline("Eating deep fried food made your %s very slippery.",pcVar5);
              }
            }
          }
        }
        else {
          b_trapped("tin",0);
          costly_tin("destroyed");
        }
        if ((tin.tin)->where == '\x03') {
          useup(tin.tin);
        }
        else {
          useupf(tin.tin,1);
        }
        tin.tin = (obj *)0x0;
        what._4_4_ = 0;
      }
    }
    else {
      tin.usedtime = iVar4;
      pline("You give up your attempt to open the tin.");
      what._4_4_ = 0;
    }
  }
  else {
    what._4_4_ = 0;
  }
  return what._4_4_;
}

Assistant:

static int opentin(void) /* called during each move whilst opening a tin */
{
	int r;
	const char *what;
	int which;

	if (!carried(tin.tin) && !obj_here(tin.tin, u.ux, u.uy))
					/* perhaps it was stolen? */
		return 0;		/* %% probably we should use tinoid */
	if (tin.usedtime++ >= 50) {
		pline("You give up your attempt to open the tin.");
		return 0;
	}
	if (tin.usedtime < tin.reqtime)
		return 1;		/* still busy */
	if (tin.tin->otrapped ||
	   (tin.tin->cursed && tin.tin->spe != -1 && !rn2(8))) {
		b_trapped("tin", 0);
		costly_tin("destroyed");
		goto use_me;
	}
	pline("You succeed in opening the tin.");
	if (tin.tin->spe != 1) {
	    if (tin.tin->corpsenm == NON_PM) {
		pline("It turns out to be empty.");
		tin.tin->dknown = tin.tin->known = TRUE;
		costly_tin(NULL);
		goto use_me;
	    }
	    if (tin.tin->cursed) {
		r = ROTTEN_TIN;			/* always rotten if cursed */
	    } else if (tin.tin->spe == -1) {
		r = HOMEMADE_TIN;		/* player made it */
	    } else {
		r = rn2(TTSZ - 2);		/* else take your pick */
	    }
	    if (tin.tin->corpsenm == PM_GIANT_TURTLE && !tin.tin->cursed) {
		/* Giant turtles are always endangeredelicious! */
		r = DELICIOUS_SOUP_TIN;
	    }
	    if (r == ROTTEN_TIN && (tin.tin->corpsenm == PM_LIZARD ||
			tin.tin->corpsenm == PM_LICHEN))
		r = HOMEMADE_TIN;		/* lizards don't rot */
	    else if (tin.tin->spe == -1 && !tin.tin->blessed && !rn2(7))
		r = ROTTEN_TIN;			/* some homemade tins go bad */
	    which = 0;	/* 0=>plural, 1=>as-is, 2=>"the" prefix */
	    if (Hallucination) {
		what = rndmonnam();
	    } else {
		what = mons_mname(&mons[tin.tin->corpsenm]);
		if (mons[tin.tin->corpsenm].geno & G_UNIQ)
		    which = type_is_pname(&mons[tin.tin->corpsenm]) ? 1 : 2;
	    }
	    if (which == 0) what = makeplural(what);
	    pline("It smells like %s%s.", (which == 2) ? "the " : "", what);
	    if (yn("Eat it?") == 'n') {
		if (!Hallucination) tin.tin->dknown = tin.tin->known = TRUE;
		if (flags.verbose) pline("You discard the open tin.");
		costly_tin(NULL);
		goto use_me;
	    }
	    /* in case stop_occupation() was called on previous meal */
	    victual.piece = NULL;
	    victual.fullwarn = victual.eating = victual.doreset = FALSE;

	    pline("You consume %s %s.", tintxts[r].txt,
			mons_mname(&mons[tin.tin->corpsenm]));

	    /* SZECHUAN_TIN might have free fortune cookie */
	    if (r == SZECHUAN_TIN && rn2(2)) {
		struct obj *cookie = mksobj(level, FORTUNE_COOKIE, FALSE, FALSE);
		cookie->blessed = tin.tin->blessed;
		cookie->cursed = tin.tin->cursed;
#ifdef INVISIBLE_OBJECTS
		cookie->oinvis = tin.tin->oinvis;
#endif
		pline("There is a free fortune cookie inside!");
		hold_another_object(cookie, "It falls to the floor.", NULL, NULL);
	    }

	    /* KMH, conduct */
	    /* Eating a tin of monster meat breaks food-conducts here. */
	    if (!vegetarian(&mons[tin.tin->corpsenm]))
		violated(CONDUCT_VEGETARIAN);
	    else if (!vegan(&mons[tin.tin->corpsenm]))
		violated(CONDUCT_VEGAN);
	    else
		violated(CONDUCT_FOODLESS);

	    tin.tin->dknown = tin.tin->known = TRUE;
	    cprefx(tin.tin->corpsenm); cpostfx(tin.tin->corpsenm);

	    /* charge for one at pre-eating cost */
	    costly_tin(NULL);

	    /* check for vomiting added by GAN 01/16/87 */
	    if (tintxts[r].nut < 0) make_vomiting((long)rn1(15,10), FALSE);
	    else lesshungry(tintxts[r].nut);

	    if (r == 0 || r == FRENCH_FRIED_TIN) {
	        /* Assume !Glib, because you can't open tins when Glib. */
		incr_itimeout(&Glib, rnd(15));
		pline("Eating deep fried food made your %s very slippery.",
		      makeplural(body_part(FINGER)));
	    }
	} else {
	    if (tin.tin->cursed)
		pline("It contains some decaying%s%s substance.",
			Blind ? "" : " ", Blind ? "" : hcolor("green"));
	    else
		pline("It contains spinach.");

	    if (yn("Eat it?") == 'n') {
		if (!Hallucination && !tin.tin->cursed)
		    tin.tin->dknown = tin.tin->known = TRUE;
		if (flags.verbose)
		    pline("You discard the open tin.");
		costly_tin(NULL);
		goto use_me;
	    }

	    tin.tin->dknown = tin.tin->known = TRUE;
	    costly_tin(NULL);

	    if (!tin.tin->cursed)
		pline("This makes you feel like %s!",
		      Hallucination ? "Swee'pea" : "Popeye");
	    lesshungry(600);
	    gainstr(tin.tin, 0, FALSE);
	    /* Eating a tin of spinach breaks foodless-conduct here. */
	    violated(CONDUCT_FOODLESS);
	}
use_me:
	if (carried(tin.tin)) useup(tin.tin);
	else useupf(tin.tin, 1L);
	tin.tin = NULL;
	return 0;
}